

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O1

JavascriptArray *
Js::JavascriptObject::CreateKeysHelper
          (RecyclableObject *object,ScriptContext *scriptContext,BOOL includeNonEnumerable,
          bool includeSymbolProperties,bool includeStringProperties,bool includeSpecialProperties)

{
  code *pcVar1;
  Type TVar2;
  JavascriptString *newValue;
  ScriptContext *pSVar3;
  bool bVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  undefined4 *puVar8;
  JavascriptArray *this;
  EnumeratorCache *pEVar9;
  PropertyRecord *propertyRecord;
  Var newValue_00;
  JavascriptSymbol *newValue_01;
  SparseArraySegmentBase *pSVar10;
  undefined4 extraout_var;
  undefined7 in_register_00000009;
  uint32 uVar11;
  uint uVar12;
  uint32 offset;
  ulong uVar13;
  undefined4 uVar14;
  uint uVar15;
  JavascriptArray *this_00;
  undefined1 auStack_c8 [8];
  JavascriptStaticEnumerator enumerator;
  PropertyId local_54;
  JavascriptString *pJStack_50;
  PropertyId propertyId;
  ScriptContext *local_48;
  JavascriptArray *local_40;
  ulong local_38;
  
  local_48 = scriptContext;
  if (!includeSymbolProperties && !includeStringProperties) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x4cc,"(includeStringProperties || includeSymbolProperties)",
                                "Should either get string or symbol properties.");
    if (!bVar4) {
LAB_00cf2cd9:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar8 = 0;
  }
  auStack_c8 = (undefined1  [8])0x0;
  enumerator.propertyEnumerator.scriptContext.ptr = (ScriptContext *)0x0;
  enumerator.propertyEnumerator.object.ptr = (DynamicObject *)0x0;
  enumerator.propertyEnumerator.enumeratedCount = 0;
  enumerator.propertyEnumerator.flags = None;
  enumerator.propertyEnumerator._37_3_ = 0;
  enumerator.propertyEnumerator.cachedData.ptr = (CachedData *)0x0;
  enumerator.currentEnumerator.ptr = (JavascriptEnumerator *)0x0;
  enumerator.prefixEnumerator.ptr = (JavascriptEnumerator *)0x0;
  uVar13 = 0;
  JavascriptStaticEnumerator::Clear
            ((JavascriptStaticEnumerator *)auStack_c8,None,(ScriptContext *)0x0);
  pSVar3 = local_48;
  this = JavascriptLibrary::CreateArray((local_48->super_ScriptContextBase).javascriptLibrary,0);
  bVar5 = includeNonEnumerable == 0 ^ 0xd;
  local_40 = (JavascriptArray *)
             CONCAT44(local_40._4_4_,(int)CONCAT71(in_register_00000009,includeSymbolProperties));
  bVar6 = bVar5 | 2;
  if (!includeSymbolProperties) {
    bVar6 = bVar5;
  }
  pEVar9 = JavascriptLibrary::GetCreateKeysCache
                     ((pSVar3->super_ScriptContextBase).javascriptLibrary,(object->type).ptr);
  iVar7 = (*(object->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x2b])(object,auStack_c8,(ulong)bVar6,pSVar3,pEVar9);
  if (iVar7 != 0) {
    pJStack_50 = (JavascriptString *)0x0;
    pJStack_50 = JavascriptStaticEnumerator::MoveAndGetNext
                           ((JavascriptStaticEnumerator *)auStack_c8,&local_54,
                            (PropertyAttributes *)0x0);
    this_00 = (JavascriptArray *)0x0;
    if (pJStack_50 != (JavascriptString *)0x0) {
      this_00 = (JavascriptArray *)0x0;
      enumerator.arrayEnumerator.ptr = (JavascriptEnumerator *)__tls_get_addr(&PTR_0155fe48);
      uVar13 = 0;
      iVar7 = 0;
      do {
        local_38 = CONCAT44(local_38._4_4_,iVar7);
        uVar14 = local_40._0_4_;
        while (((char)uVar14 == '\0' ||
               (propertyRecord = ScriptContext::GetPropertyName(local_48,local_54),
               propertyRecord->isSymbol != true))) {
          if (includeStringProperties) {
            newValue_00 = CrossSite::MarshalVar
                                    (local_48,pJStack_50,
                                     (((((pJStack_50->super_RecyclableObject).type.ptr)->
                                       javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                                     scriptContext.ptr);
            JavascriptArray::DirectSetItemAt<void*>(this,(uint32)uVar13,newValue_00);
            uVar13 = (ulong)((uint32)uVar13 + 1);
            uVar14 = local_40._0_4_;
          }
          pJStack_50 = JavascriptStaticEnumerator::MoveAndGetNext
                                 ((JavascriptStaticEnumerator *)auStack_c8,&local_54,
                                  (PropertyAttributes *)0x0);
          if (pJStack_50 == (JavascriptString *)0x0) goto LAB_00cf2b66;
        }
        newValue_01 = ScriptContext::GetSymbol(local_48,propertyRecord);
        if (this_00 == (JavascriptArray *)0x0) {
          this_00 = JavascriptLibrary::CreateArray
                              ((local_48->super_ScriptContextBase).javascriptLibrary,0);
        }
        iVar7 = (uint)local_38 + 1;
        if (iVar7 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          TVar2 = enumerator.arrayEnumerator;
          *(undefined4 *)
           &((enumerator.arrayEnumerator.ptr)->super_RecyclableObject).super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptArray.inl"
                                      ,0x1d5,"(itemIndex < InvalidIndex)","itemIndex < InvalidIndex"
                                     );
          if (!bVar4) goto LAB_00cf2cd9;
          *(undefined4 *)
           &((TVar2.ptr)->super_RecyclableObject).super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 0;
        }
        pSVar10 = JavascriptArray::GetLastUsedSegment(this_00);
        uVar11 = (uint)local_38 - pSVar10->left;
        if (((uint)local_38 < pSVar10->left) || (pSVar10->size <= uVar11)) {
          JavascriptArray::DirectSetItem_Full<Js::JavascriptSymbol*>
                    (this_00,(uint)local_38,newValue_01);
        }
        else {
          JavascriptArray::DirectSetItemInLastUsedSegmentAt<Js::JavascriptSymbol*>
                    (this_00,uVar11,newValue_01);
        }
        pJStack_50 = JavascriptStaticEnumerator::MoveAndGetNext
                               ((JavascriptStaticEnumerator *)auStack_c8,&local_54,
                                (PropertyAttributes *)0x0);
      } while (pJStack_50 != (JavascriptString *)0x0);
    }
LAB_00cf2b66:
    local_40 = this;
    local_38 = uVar13;
    if (includeStringProperties && includeSpecialProperties) {
      uVar15 = 0;
      iVar7 = (*(object->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x3f])(object,0,&stack0xffffffffffffffb0,local_48);
      if (iVar7 != 0) {
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        do {
          newValue = pJStack_50;
          uVar11 = (int)local_38 + uVar15;
          if (uVar11 == 0xffffffff) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar8 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptArray.inl"
                                        ,0x1d5,"(itemIndex < InvalidIndex)",
                                        "itemIndex < InvalidIndex");
            if (!bVar4) goto LAB_00cf2cd9;
            *puVar8 = 0;
          }
          pSVar10 = JavascriptArray::GetLastUsedSegment(local_40);
          if ((uVar11 < pSVar10->left) || (offset = uVar11 - pSVar10->left, pSVar10->size <= offset)
             ) {
            JavascriptArray::DirectSetItem_Full<Js::JavascriptString*>(local_40,uVar11,newValue);
          }
          else {
            JavascriptArray::DirectSetItemInLastUsedSegmentAt<Js::JavascriptString*>
                      (local_40,offset,newValue);
          }
          uVar15 = uVar15 + 1;
          iVar7 = (*(object->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x3f])
                            (object,(ulong)uVar15,&stack0xffffffffffffffb0,local_48);
        } while (iVar7 != 0);
        local_38 = (ulong)((int)local_38 + uVar15);
      }
    }
    uVar13 = local_38;
    this = local_40;
    if ((this_00 != (JavascriptArray *)0x0) &&
       (uVar15 = (this_00->super_ArrayObject).length, uVar15 != 0)) {
      uVar12 = 0;
      do {
        iVar7 = (*(this_00->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                  [0x72])(this_00,(ulong)uVar12);
        JavascriptArray::DirectSetItemAt<void*>
                  (local_40,(int)uVar13 + uVar12,(Var)CONCAT44(extraout_var,iVar7));
        uVar12 = uVar12 + 1;
        this = local_40;
      } while (uVar15 != uVar12);
    }
  }
  return this;
}

Assistant:

JavascriptArray* JavascriptObject::CreateKeysHelper(RecyclableObject* object, ScriptContext* scriptContext, BOOL includeNonEnumerable, bool includeSymbolProperties, bool includeStringProperties, bool includeSpecialProperties)
{
    //1. Let keys be a new empty List.
    //2. For each own property key P of O that is an integer index, in ascending numeric index order
    //      a. Add P as the last element of keys.
    //3. For each own property key P of O that is a String but is not an integer index, in property creation order
    //      a. Add P as the last element of keys.
    //4. For each own property key P of O that is a Symbol, in property creation order
    //      a. Add P as the last element of keys.
    //5. Return keys.
    AssertMsg(includeStringProperties || includeSymbolProperties, "Should either get string or symbol properties.");

    JavascriptStaticEnumerator enumerator;
    EnumeratorFlags flags = EnumeratorFlags::SnapShotSemantics | EnumeratorFlags::UseCache;
    JavascriptArray* newArr = scriptContext->GetLibrary()->CreateArray(0);
    if (includeNonEnumerable)
    {
        flags |= EnumeratorFlags::EnumNonEnumerable;
    }
    if (includeSymbolProperties)
    {
        flags |= EnumeratorFlags::EnumSymbols;
    }
    EnumeratorCache* cache = scriptContext->GetLibrary()->GetCreateKeysCache(object->GetType());
    if (!object->GetEnumerator(&enumerator, flags, scriptContext, cache))
    {
        return newArr;  // Return an empty array if we don't have an enumerator
    }

    JavascriptString * propertyName = nullptr;
    PropertyId propertyId;
    uint32 propertyIndex = 0;
    uint32 symbolIndex = 0;
    const PropertyRecord* propertyRecord;
    JavascriptSymbol* symbol;
    JavascriptArray* newArrForSymbols = nullptr;
    while ((propertyName = enumerator.MoveAndGetNext(propertyId)) != NULL)
    {
        if (propertyName)
        {
            if (includeSymbolProperties)
            {
                propertyRecord = scriptContext->GetPropertyName(propertyId);

                if (propertyRecord->IsSymbol())
                {
                    symbol = scriptContext->GetSymbol(propertyRecord);
                    // no need to marshal symbol because it is created from scriptContext
                    if (!newArrForSymbols)
                    {
                        newArrForSymbols = scriptContext->GetLibrary()->CreateArray(0);
                    }
                    newArrForSymbols->DirectSetItemAt(symbolIndex++, symbol);
                    continue;
                }
            }
            if (includeStringProperties)
            {
                newArr->DirectSetItemAt(propertyIndex++, CrossSite::MarshalVar(scriptContext, propertyName, propertyName->GetScriptContext()));
            }
        }
    }

    // Special properties
    if (includeSpecialProperties && includeStringProperties)
    {
        uint32 index = 0;
        while (object->GetSpecialPropertyName(index, &propertyName, scriptContext))
        {
            newArr->DirectSetItemAt(propertyIndex++, propertyName);
            index++;
        }
    }

    if (newArrForSymbols)
    {
        // Append all the symbols at the end of list
        uint32 totalSymbols = newArrForSymbols->GetLength();
        for (uint32 symIndex = 0; symIndex < totalSymbols; symIndex++)
        {
            newArr->DirectSetItemAt(propertyIndex++, newArrForSymbols->DirectGetItem(symIndex));
        }
    }

    return newArr;
}